

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

int get_byte(MIR_context_t ctx)

{
  undefined1 auVar1 [16];
  reduce_data *prVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  uint8_t *puVar5;
  size_t sVar6;
  uint64_t uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  uint8_t tag;
  uint8_t u;
  uint8_t u_1;
  uint8_t u_2;
  ulong in_stack_00000058;
  byte local_5f;
  byte local_5e;
  byte local_5d;
  byte local_5c;
  byte local_5b;
  byte local_5a;
  byte local_59;
  reduce_data *local_58;
  reduce_reader_t local_50;
  uint8_t *local_48;
  MIR_context_t local_40;
  undefined1 local_38 [8];
  
  prVar2 = ctx->io_ctx->io_reduce_data;
  uVar10 = (prVar2->u).decode.buf_get_pos;
  if (prVar2->buf_bound <= uVar10) {
    local_40 = ctx;
    if ((prVar2->u).decode.eof_p != '\0') {
LAB_00144e08:
      (*local_40->error_func)(MIR_binary_io_error,"unfinished binary MIR");
LAB_00144e21:
      __assert_fail("(u >> (8 - n)) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-reduce.h"
                    ,0x89,"int64_t _reduce_uint_read(reduce_reader_t, void *)");
    }
    local_50 = (prVar2->u).decode.reader;
    local_48 = prVar2->buf;
    uVar9 = 0;
    uVar10 = 0;
    local_58 = prVar2;
LAB_001449a9:
    sVar6 = (*local_50)(&local_5f,1,local_58->aux_data);
    if (sVar6 != 0) {
      if (local_5f == 0) {
        sVar6 = (*local_50)(local_38,8,local_58->aux_data);
        if ((sVar6 == 8) &&
           (sVar6 = (*local_50)(&local_5f,1,local_58->aux_data), prVar2 = local_58, sVar6 == 0)) {
          if (uVar9 != 0) {
            uVar7 = mir_hash_strict(local_48,(ulong)uVar9,local_58->check_hash);
            prVar2->check_hash = uVar7;
          }
          auVar1._8_8_ = 0;
          auVar1._0_8_ = in_stack_00000058;
          auVar15 = vpmovzxbq_avx512f(auVar1);
          auVar15 = vpsllvq_avx512f(auVar15,_DAT_001ac680);
          auVar14 = vextracti64x4_avx512f(auVar15,1);
          auVar15 = vporq_avx512f(auVar15,ZEXT3264(auVar14));
          auVar1 = vpor_avx(auVar15._0_16_,auVar15._16_16_);
          auVar4 = vpshufd_avx(auVar1,0xee);
          auVar1 = vpor_avx(auVar1,auVar4);
          if (auVar1._0_8_ != prVar2->check_hash) goto LAB_00144dfc;
          (local_58->u).decode.eof_p = '\x01';
          (local_58->u).decode.buf_get_pos = 0;
          local_58->buf_bound = uVar9;
          if (uVar9 == 0) goto LAB_00144e08;
          (local_58->u).decode.buf_get_pos = 1;
          goto LAB_00144de7;
        }
      }
      else {
        uVar11 = uVar10;
        if (0x1f < local_5f) {
          uVar8 = (uint)(local_5f >> 5);
          if (uVar8 == 7) {
            pvVar3 = local_58->aux_data;
            sVar6 = (*local_50)(&local_5e,1,pvVar3);
            uVar8 = (uint)local_5e;
            if (sVar6 != 1) goto LAB_00144dfc;
            iVar12 = -1;
            do {
              if (local_5e >> (iVar12 + 8U & 0x1f) == 1) {
                uVar13 = -iVar12;
                uVar8 = 0xffU >> (uVar13 & 0x1f) & uVar8;
                if (1 < uVar13) goto LAB_00144a6a;
                goto LAB_00144a97;
              }
              iVar12 = iVar12 + -1;
            } while (iVar12 != -5);
            if ((uVar8 & 0xfffffff8) != 8) goto LAB_00144e21;
            uVar8 = uVar8 & 7;
            uVar13 = 5;
LAB_00144a6a:
            iVar12 = uVar13 - 1;
            do {
              sVar6 = (*local_50)(&local_5d,1,pvVar3);
              if (sVar6 != 1) goto LAB_00144dfc;
              uVar8 = uVar8 << 8 | (uint)local_5d;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
LAB_00144a97:
          if (((0x7ff < uVar8) || (0x40000 < uVar8 + uVar9)) ||
             (sVar6 = (*local_50)(local_48 + uVar9,(ulong)uVar8,local_58->aux_data), sVar6 != uVar8)
             ) goto LAB_00144dfc;
          if (uVar8 != 0) {
            uVar11 = uVar8 + uVar10;
            do {
              *(uint *)((long)&local_58->u + (ulong)uVar10 * 4 + 0x10) = uVar9;
              uVar9 = uVar9 + 1;
              uVar10 = uVar10 + 1;
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
          }
        }
        uVar8 = local_5f & 0x1f;
        uVar10 = uVar11;
        if ((local_5f & 0x1f) == 0) {
LAB_00144cc9:
          puVar5 = local_48;
          prVar2 = local_58;
          if (0x3ffff < uVar9) goto code_r0x00144cd6;
          goto LAB_001449a9;
        }
        if ((char)uVar8 == '\x1f') {
          pvVar3 = local_58->aux_data;
          sVar6 = (*local_50)(&local_5c,1,pvVar3);
          uVar8 = (uint)local_5c;
          if (sVar6 != 1) goto LAB_00144dfc;
          iVar12 = -1;
          do {
            if (local_5c >> (iVar12 + 8U & 0x1f) == 1) {
              uVar10 = -iVar12;
              uVar8 = 0xffU >> (uVar10 & 0x1f) & uVar8;
              if (1 < uVar10) goto LAB_00144b99;
              goto LAB_00144bc6;
            }
            iVar12 = iVar12 + -1;
          } while (iVar12 != -5);
          if ((uVar8 & 0xfffffff8) != 8) goto LAB_00144e21;
          uVar8 = uVar8 & 7;
          uVar10 = 5;
LAB_00144b99:
          iVar12 = uVar10 - 1;
          do {
            sVar6 = (*local_50)(&local_5b,1,pvVar3);
            if (sVar6 != 1) goto LAB_00144dfc;
            uVar8 = uVar8 << 8 | (uint)local_5b;
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
LAB_00144bc6:
        pvVar3 = local_58->aux_data;
        sVar6 = (*local_50)(&local_5a,1,pvVar3);
        uVar10 = (uint)local_5a;
        if (sVar6 != 1) goto LAB_00144dfc;
        uVar8 = uVar8 + 3;
        iVar12 = -1;
        do {
          if (local_5a >> (iVar12 + 8U & 0x1f) == 1) {
            uVar13 = -iVar12;
            uVar10 = 0xffU >> (uVar13 & 0x1f) & uVar10;
            if (1 < uVar13) goto LAB_00144c4c;
            goto LAB_00144c7b;
          }
          iVar12 = iVar12 + -1;
        } while (iVar12 != -5);
        if ((uVar10 & 0xfffffff8) != 8) goto LAB_00144e21;
        uVar10 = uVar10 & 7;
        uVar13 = 5;
LAB_00144c4c:
        iVar12 = uVar13 - 1;
        do {
          sVar6 = (*local_50)(&local_59,1,pvVar3);
          if (sVar6 != 1) goto LAB_00144dfc;
          uVar10 = uVar10 << 8 | (uint)local_59;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
LAB_00144c7b:
        if ((uVar10 <= uVar11) &&
           (uVar10 = *(uint *)((long)&local_58->u + (ulong)(uVar11 - uVar10) * 4 + 0x10),
           uVar10 + uVar8 < 0x40001)) {
          memcpy(local_48 + uVar9,local_48 + uVar10,(ulong)uVar8);
          uVar10 = uVar11 + 1;
          *(uint *)((long)&local_58->u + (ulong)uVar11 * 4 + 0x10) = uVar9;
          uVar9 = uVar8 + uVar9;
          goto LAB_00144cc9;
        }
      }
    }
LAB_00144dfc:
    local_58->ok_p = '\0';
    goto LAB_00144e08;
  }
  (prVar2->u).decode.buf_get_pos = uVar10 + 1;
  local_48 = prVar2->buf + uVar10;
LAB_00144de7:
  return (int)*local_48;
code_r0x00144cd6:
  if (uVar9 != 0x40000) {
    __assert_fail("pos == _REDUCE_BUF_LEN",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-reduce.h"
                  ,0x19d,"int reduce_decode_get(struct reduce_data *)");
  }
  uVar7 = mir_hash_strict(local_48,0x40000,local_58->check_hash);
  prVar2->check_hash = uVar7;
  prVar2->buf_bound = 0x40000;
  (prVar2->u).decode.buf_get_pos = 1;
  local_48 = puVar5;
  goto LAB_00144de7;
}

Assistant:

static int get_byte (MIR_context_t ctx) {
#ifdef MIR_NO_BIN_COMPRESSION
  int c = io_reader (ctx);
#else
  int c = reduce_decode_get (io_reduce_data);
#endif

  if (c == EOF) MIR_get_error_func (ctx) (MIR_binary_io_error, "unfinished binary MIR");
  return c;
}